

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record_file.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  uint uVar1;
  ring_buffer_size_t rVar2;
  PaDeviceInfo *pPVar3;
  char *pcVar4;
  uint numBytes;
  uint numSamples;
  uint delayCntr;
  paTestData data;
  PaStream *pPStack_58;
  PaError err;
  PaStream *stream;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  
  data.threadHandle._4_4_ = 0;
  memset(&numSamples,0,0x58);
  printf("patest_record.c\n");
  fflush(_stdout);
  uVar1 = NextPowerOf2(0xac44);
  data._0_8_ = PaUtil_AllocateMemory((ulong)(uVar1 << 2));
  if ((void *)data._0_8_ == (void *)0x0) {
    printf("Could not allocate ring buffer data.\n");
  }
  else {
    rVar2 = PaUtil_InitializeRingBuffer
                      ((PaUtilRingBuffer *)&data.ringBufferData,4,(ulong)uVar1,(void *)data._0_8_);
    if (rVar2 < 0) {
      printf("Failed to initialize ring buffer. Size is not power of 2 ??\n");
    }
    else {
      data.threadHandle._4_4_ = Pa_Initialize();
      if (data.threadHandle._4_4_ == 0) {
        outputParameters.hostApiSpecificStreamInfo._0_4_ = Pa_GetDefaultInputDevice();
        if ((PaDeviceIndex)outputParameters.hostApiSpecificStreamInfo == -1) {
          fprintf(_stderr,"Error: No default input device.\n");
        }
        else {
          outputParameters.hostApiSpecificStreamInfo._4_4_ = 2;
          Pa_GetDeviceInfo((PaDeviceIndex)outputParameters.hostApiSpecificStreamInfo);
          data.threadHandle._4_4_ =
               Pa_OpenStream(&stack0xffffffffffffffa8,
                             (PaStreamParameters *)&outputParameters.hostApiSpecificStreamInfo,
                             (PaStreamParameters *)0x0,44100.0,0x200,1,recordCallback,&numSamples);
          if ((((data.threadHandle._4_4_ == 0) &&
               (data.ringBuffer.buffer = (char *)fopen("audio_data.raw","wb"),
               (FILE *)data.ringBuffer.buffer != (FILE *)0x0)) &&
              (data.threadHandle._4_4_ =
                    startThread((paTestData *)&numSamples,threadFunctionWriteToRawFile),
              data.threadHandle._4_4_ == 0)) &&
             (data.threadHandle._4_4_ = Pa_StartStream(pPStack_58), data.threadHandle._4_4_ == 0)) {
            printf("\n=== Now recording to \'audio_data.raw\' for %d seconds!! Please speak into the microphone. ===\n"
                   ,10);
            fflush(_stdout);
            numBytes = 0;
            while (numBytes < 10) {
              printf("index = %d\n",(ulong)numSamples);
              fflush(_stdout);
              Pa_Sleep(1000);
              numBytes = numBytes + 1;
            }
            if (((-1 < (int)data.threadHandle._4_4_) &&
                (data.threadHandle._4_4_ = Pa_CloseStream(pPStack_58), data.threadHandle._4_4_ == 0)
                ) && (data.threadHandle._4_4_ = stopThread((paTestData *)&numSamples),
                     data.threadHandle._4_4_ == 0)) {
              fclose((FILE *)data.ringBuffer.buffer);
              data.ringBuffer.buffer = (char *)0x0;
              numSamples = 0;
              stream._0_4_ = Pa_GetDefaultOutputDevice();
              if ((PaDeviceIndex)stream == -1) {
                fprintf(_stderr,"Error: No default output device.\n");
              }
              else {
                stream._4_4_ = 2;
                outputParameters.device = 1;
                outputParameters.channelCount = 0;
                pPVar3 = Pa_GetDeviceInfo((PaDeviceIndex)stream);
                outputParameters.sampleFormat = (PaSampleFormat)pPVar3->defaultLowOutputLatency;
                outputParameters.suggestedLatency = 0.0;
                printf(
                      "\n=== Now playing back from file \'audio_data.raw\' until end-of-file is reached ===\n"
                      );
                fflush(_stdout);
                data.threadHandle._4_4_ =
                     Pa_OpenStream(&stack0xffffffffffffffa8,(PaStreamParameters *)0x0,
                                   (PaStreamParameters *)&stream,44100.0,0x200,1,playCallback,
                                   &numSamples);
                if ((data.threadHandle._4_4_ == 0) && (pPStack_58 != (PaStream *)0x0)) {
                  data.ringBuffer.buffer = (char *)fopen("audio_data.raw","rb");
                  if ((FILE *)data.ringBuffer.buffer != (FILE *)0x0) {
                    data.threadHandle._4_4_ =
                         startThread((paTestData *)&numSamples,threadFunctionReadFromRawFile);
                    if ((data.threadHandle._4_4_ != 0) ||
                       (data.threadHandle._4_4_ = Pa_StartStream(pPStack_58),
                       data.threadHandle._4_4_ != 0)) goto LAB_00106922;
                    printf("Waiting for playback to finish.\n");
                    fflush(_stdout);
                    while (data.threadHandle._4_4_ = Pa_IsStreamActive(pPStack_58),
                          data.threadHandle._4_4_ == 1) {
                      printf("index = %d\n",(ulong)numSamples);
                      fflush(_stdout);
                      Pa_Sleep(1000);
                    }
                    if ((int)data.threadHandle._4_4_ < 0) goto LAB_00106922;
                  }
                  data.threadHandle._4_4_ = Pa_CloseStream(pPStack_58);
                  if (data.threadHandle._4_4_ == 0) {
                    fclose((FILE *)data.ringBuffer.buffer);
                    printf("Done.\n");
                    fflush(_stdout);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00106922:
  Pa_Terminate();
  if (data._0_8_ != 0) {
    PaUtil_FreeMemory((void *)data._0_8_);
  }
  if (data.threadHandle._4_4_ != 0) {
    fprintf(_stderr,"An error occured while using the portaudio stream\n");
    fprintf(_stderr,"Error number: %d\n",(ulong)data.threadHandle._4_4_);
    __stream = _stderr;
    pcVar4 = Pa_GetErrorText(data.threadHandle._4_4_);
    fprintf(__stream,"Error message: %s\n",pcVar4);
    data.threadHandle._4_4_ = 1;
  }
  return data.threadHandle._4_4_;
}

Assistant:

int main(void)
{
    PaStreamParameters  inputParameters,
                        outputParameters;
    PaStream*           stream;
    PaError             err = paNoError;
    paTestData          data = {0};
    unsigned            delayCntr;
    unsigned            numSamples;
    unsigned            numBytes;

    printf("patest_record.c\n"); fflush(stdout);

    /* We set the ring buffer size to about 500 ms */
    numSamples = NextPowerOf2((unsigned)(SAMPLE_RATE * 0.5 * NUM_CHANNELS));
    numBytes = numSamples * sizeof(SAMPLE);
    data.ringBufferData = (SAMPLE *) PaUtil_AllocateMemory( numBytes );
    if( data.ringBufferData == NULL )
    {
        printf("Could not allocate ring buffer data.\n");
        goto done;
    }

    if (PaUtil_InitializeRingBuffer(&data.ringBuffer, sizeof(SAMPLE), numSamples, data.ringBufferData) < 0)
    {
        printf("Failed to initialize ring buffer. Size is not power of 2 ??\n");
        goto done;
    }

    err = Pa_Initialize();
    if( err != paNoError ) goto done;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default input device.\n");
        goto done;
    }
    inputParameters.channelCount = 2;                    /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    /* Record some audio. -------------------------------------------- */
    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              NULL,                  /* &outputParameters, */
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              recordCallback,
              &data );
    if( err != paNoError ) goto done;

    /* Open the raw audio 'cache' file... */
    data.file = fopen(FILE_NAME, "wb");
    if (data.file == 0) goto done;

    /* Start the file writing thread */
    err = startThread(&data, threadFunctionWriteToRawFile);
    if( err != paNoError ) goto done;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto done;
    printf("\n=== Now recording to '" FILE_NAME "' for %d seconds!! Please speak into the microphone. ===\n", NUM_SECONDS); fflush(stdout);

    /* Note that the RECORDING part is limited with TIME, not size of the file and/or buffer, so you can
       increase NUM_SECONDS until you run out of disk */
    delayCntr = 0;
    while( delayCntr++ < NUM_SECONDS )
    {
        printf("index = %d\n", data.frameIndex ); fflush(stdout);
        Pa_Sleep(1000);
    }
    if( err < 0 ) goto done;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto done;

    /* Stop the thread */
    err = stopThread(&data);
    if( err != paNoError ) goto done;

    /* Close file */
    fclose(data.file);
    data.file = 0;

    /* Playback recorded data.  -------------------------------------------- */
    data.frameIndex = 0;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default output device.\n");
        goto done;
    }
    outputParameters.channelCount = 2;                     /* stereo output */
    outputParameters.sampleFormat =  PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    printf("\n=== Now playing back from file '" FILE_NAME "' until end-of-file is reached ===\n"); fflush(stdout);
    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              playCallback,
              &data );
    if( err != paNoError ) goto done;

    if( stream )
    {
        /* Open file again for reading */
        data.file = fopen(FILE_NAME, "rb");
        if (data.file != 0)
        {
            /* Start the file reading thread */
            err = startThread(&data, threadFunctionReadFromRawFile);
            if( err != paNoError ) goto done;

            err = Pa_StartStream( stream );
            if( err != paNoError ) goto done;

            printf("Waiting for playback to finish.\n"); fflush(stdout);

            /* The playback will end when EOF is reached */
            while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) {
                printf("index = %d\n", data.frameIndex ); fflush(stdout);
                Pa_Sleep(1000);
            }
            if( err < 0 ) goto done;
        }
        
        err = Pa_CloseStream( stream );
        if( err != paNoError ) goto done;

        fclose(data.file);
        
        printf("Done.\n"); fflush(stdout);
    }

done:
    Pa_Terminate();
    if( data.ringBufferData )       /* Sure it is NULL or valid. */
        PaUtil_FreeMemory( data.ringBufferData );
    if( err != paNoError )
    {
        fprintf( stderr, "An error occured while using the portaudio stream\n" );
        fprintf( stderr, "Error number: %d\n", err );
        fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
        err = 1;          /* Always return 0 or 1, but no other return codes. */
    }
    return err;
}